

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

bool __thiscall
despot::Function::SetValue
          (Function *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys,int key_pos,int pid,int cid,vector<double,_std::allocator<double>_> *values,
          int start,int end)

{
  double dVar1;
  pointer ppNVar2;
  pointer pvVar3;
  pointer pbVar4;
  NamedVar *this_00;
  pointer pbVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  NamedVar **ppNVar10;
  mapped_type *pmVar11;
  ostream *poVar12;
  ulong uVar13;
  long lVar14;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *this_01;
  int iVar15;
  int i;
  int iVar16;
  ulong uVar17;
  int cid_local;
  long local_68;
  int local_5c;
  Function *local_58;
  string local_50;
  
  lVar14 = (long)key_pos;
  ppNVar2 = (this->parents_).
            super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  cid_local = cid;
  if (((long)(this->parents_).
             super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppNVar2 >> 3) + 1 == lVar14) {
    if (end + -1 != start) {
      __assert_fail("start == end - 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/parser/function.cpp"
                    ,0x26,
                    "bool despot::Function::SetValue(vector<string> &, int, int, int, const vector<double> &, int, int)"
                   );
    }
    pvVar3 = (this->values_).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar1 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[start];
    if ((this->values_).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == pvVar3) {
      this_01 = &(this->map_).
                 super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[pid]._M_t;
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        pmVar11 = std::
                  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                  operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                              *)this_01,&cid_local);
        *pmVar11 = dVar1;
      }
      else {
        std::
        _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
        ::erase(this_01,&cid_local);
      }
    }
    else {
      pvVar3[pid].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[cid] = dVar1;
    }
    bVar7 = true;
  }
  else {
    pbVar4 = (keys->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppNVar10 = ppNVar2 + lVar14;
    if (((long)(keys->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) + -1 == lVar14) {
      ppNVar10 = &this->child_;
    }
    this_00 = *ppNVar10;
    local_68 = lVar14;
    bVar7 = std::operator==(pbVar4 + lVar14,"*");
    if (bVar7) {
      uVar17 = 0;
      do {
        uVar13 = (long)(this_00->super_Variable).values_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this_00->super_Variable).values_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        bVar7 = uVar13 <= uVar17;
        if (uVar13 <= uVar17) {
          return bVar7;
        }
        iVar9 = (int)uVar13 * pid + (int)uVar17;
        iVar6 = cid;
        if (((long)(keys->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(keys->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5) + -1 == local_68) {
          iVar9 = pid;
          iVar6 = (int)uVar17;
        }
        bVar8 = SetValue(this,keys,key_pos + 1,iVar9,iVar6,values,start,end);
        uVar17 = uVar17 + 1;
      } while (bVar8);
    }
    else {
      bVar7 = std::operator==((keys->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar14,"-");
      if (bVar7) {
        pbVar4 = (this_00->super_Variable).values_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar5 = (this_00->super_Variable).values_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar17 = 0;
        local_5c = cid;
        local_58 = this;
        do {
          uVar13 = (long)(this_00->super_Variable).values_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this_00->super_Variable).values_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          bVar7 = uVar13 <= uVar17;
          if (uVar13 <= uVar17) {
            return bVar7;
          }
          iVar16 = (int)uVar17;
          iVar9 = (int)uVar13 * pid + iVar16;
          iVar6 = local_5c;
          if (((long)(keys->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(keys->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5) + -1 == local_68) {
            iVar9 = pid;
            iVar6 = iVar16;
          }
          iVar15 = (int)((ulong)(long)(end - start) / (ulong)((long)pbVar4 - (long)pbVar5 >> 5));
          uVar17 = uVar17 + 1;
          bVar8 = SetValue(local_58,keys,key_pos + 1,iVar9,iVar6,values,iVar16 * iVar15 + start,
                           (int)uVar17 * iVar15 + start);
        } while (bVar8);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_50,
                   (string *)
                   ((keys->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + lVar14));
        iVar9 = Variable::IndexOf(&this_00->super_Variable,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (iVar9 < 0) {
          poVar12 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
          poVar12 = std::operator<<(poVar12,(string *)
                                            ((keys->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + lVar14));
          poVar12 = std::operator<<(poVar12," is not in the domain of ");
          poVar12 = std::operator<<(poVar12,(string *)&this_00->name_);
          std::endl<char,std::char_traits<char>>(poVar12);
          bVar7 = false;
        }
        else {
          if (((long)(keys->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(keys->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5) + -1 != local_68) {
            pid = (int)((ulong)((long)(this_00->super_Variable).values_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this_00->super_Variable).values_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5) * pid + iVar9;
            iVar9 = cid;
          }
          bVar7 = SetValue(this,keys,key_pos + 1,pid,iVar9,values,start,end);
        }
      }
    }
  }
  return bVar7;
}

Assistant:

bool Function::SetValue(vector<string>& keys, int key_pos, int pid, int cid,
	const vector<double>& values, int start, int end) {
	if (key_pos == parents_.size() + 1) {
		assert(start == end - 1);

		if (values_.size() > 0) // TODO: possible refactoring to use a single data structure
			values_[pid][cid] = values[start];
		else {
			if (values[start] != 0.0) {
				map_[pid][cid] = values[start];
			} else {
				map_[pid].erase(cid);
			}
		}

		return true;
	} else {
		NamedVar* curr =
			(key_pos == keys.size() - 1) ? child_ : parents_[key_pos];
		const vector<string>& dom = curr->values();

		if (keys[key_pos] == "*") {
			for (int i = 0; i < dom.size(); i++) {
				int next_cid = cid, next_pid = pid;
				if (key_pos == keys.size() - 1)
					next_cid = i;
				else
					next_pid = pid * dom.size() + i;

				if (!SetValue(keys, key_pos + 1, next_pid, next_cid, values,
					start, end))
					return false;
			}
			return true;
		} else if (keys[key_pos] == "-") {
			int block_size = (end - start) / curr->values().size();

			for (int i = 0; i < dom.size(); i++) {
				int next_cid = cid, next_pid = pid;
				if (key_pos == keys.size() - 1)
					next_cid = i;
				else
					next_pid = pid * dom.size() + i;

				if (!SetValue(keys, key_pos + 1, next_pid, next_cid, values,
					start + i * block_size, start + (i + 1) * block_size))
					return false;
			}
			return true;
		} else {
			int id = curr->IndexOf(keys[key_pos]);
			if (id < 0) {
				cerr << "ERROR: " << keys[key_pos]
					<< " is not in the domain of " << curr->name() << endl;
				return false;
			}

			if (key_pos == keys.size() - 1)
				cid = id;
			else
				pid = pid * dom.size() + id;

			return SetValue(keys, key_pos + 1, pid, cid, values, start, end);
		}
	}
}